

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O1

void __thiscall t_generator::validate_input(t_generator *this)

{
  t_program *ptVar1;
  pointer pptVar2;
  pointer pptVar3;
  pointer pptVar4;
  pointer pptVar5;
  pointer pptVar6;
  
  ptVar1 = this->program_;
  for (pptVar2 = (ptVar1->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar2 !=
      (ptVar1->enums_).super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
    (*this->_vptr_t_generator[7])(this,*pptVar2);
  }
  ptVar1 = this->program_;
  for (pptVar3 = (ptVar1->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar3 !=
      (ptVar1->typedefs_).super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
    (*this->_vptr_t_generator[9])(this,*pptVar3);
  }
  ptVar1 = this->program_;
  for (pptVar4 = (ptVar1->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (ptVar1->objects_).super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    (*this->_vptr_t_generator[0xc])(this,*pptVar4);
  }
  ptVar1 = this->program_;
  for (pptVar5 = (ptVar1->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      pptVar5 !=
      (ptVar1->consts_).super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    (*this->_vptr_t_generator[10])(this,*pptVar5);
  }
  ptVar1 = this->program_;
  for (pptVar6 = (ptVar1->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar6 !=
      (ptVar1->services_).super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    (*this->_vptr_t_generator[0xb])(this,*pptVar6);
  }
  return;
}

Assistant:

void t_generator::validate_input() const {
  validate(program_->get_enums());
  validate(program_->get_typedefs());
  validate(program_->get_objects());
  validate(program_->get_consts());
  validate(program_->get_services());
}